

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_ecdsa_edge_cases(void)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  char cVar12;
  int iVar13;
  secp256k1_context *extraout_RAX;
  secp256k1_context *psVar14;
  secp256k1_context *extraout_RAX_00;
  secp256k1_context *extraout_RAX_01;
  secp256k1_context *extraout_RAX_02;
  secp256k1_context *extraout_RAX_03;
  secp256k1_context *extraout_RAX_04;
  secp256k1_context *extraout_RAX_05;
  secp256k1_context *extraout_RAX_06;
  secp256k1_context *extraout_RAX_07;
  secp256k1_context *extraout_RAX_08;
  secp256k1_context *extraout_RAX_09;
  secp256k1_context *extraout_RAX_10;
  secp256k1_context *extraout_RAX_11;
  secp256k1_context *extraout_RAX_12;
  secp256k1_context *extraout_RAX_13;
  secp256k1_context *extraout_RAX_14;
  secp256k1_context *extraout_RAX_15;
  secp256k1_context *extraout_RAX_16;
  long lVar15;
  long lVar16;
  void *pvVar17;
  secp256k1_context *psVar18;
  uint64_t *puVar19;
  size_t *psVar20;
  code *msg32;
  secp256k1_context *psVar21;
  secp256k1_gej *r;
  secp256k1_scalar *r_00;
  secp256k1_context *psVar22;
  int32_t _calls_to_callback_9;
  secp256k1_scalar ss_2;
  secp256k1_scalar sr;
  secp256k1_scalar ss;
  secp256k1_scalar msg;
  size_t siglen;
  secp256k1_ecdsa_signature sig;
  secp256k1_gej keyj;
  ulong local_4180;
  undefined1 local_4178 [32];
  undefined1 local_4158 [16];
  undefined1 auStack_4148 [16];
  undefined1 local_4138 [8];
  ulong uStack_4130;
  undefined1 auStack_4128 [16];
  uchar *local_4110;
  undefined1 local_4108 [4];
  undefined1 auStack_4104 [12];
  uint64_t local_40f8;
  uint64_t uStack_40f0;
  uchar local_40e8;
  size_t local_40c8 [4];
  undefined1 local_40a8 [112];
  secp256k1_gej local_4038 [53];
  uint64_t local_2038 [1025];
  
  psVar18 = (secp256k1_context *)local_4138;
  _local_4138 = ZEXT816(1);
  auStack_4128 = ZEXT816(0);
  secp256k1_scalar_verify((secp256k1_scalar *)psVar18);
  secp256k1_scalar_negate((secp256k1_scalar *)psVar18,(secp256k1_scalar *)psVar18);
  secp256k1_scalar_inverse((secp256k1_scalar *)psVar18,(secp256k1_scalar *)psVar18);
  psVar22 = (secp256k1_context *)local_4158;
  local_4158 = ZEXT816(1);
  auStack_4148 = ZEXT816(0);
  secp256k1_scalar_verify((secp256k1_scalar *)psVar22);
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,local_4038,(secp256k1_scalar *)psVar22);
  secp256k1_ge_set_gej((secp256k1_ge *)local_40a8,local_4038);
  local_40f8 = auStack_4128._0_8_;
  uStack_40f0 = auStack_4128._8_8_;
  _local_4108 = _local_4138;
  iVar13 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)psVar22,(secp256k1_scalar *)psVar18,
                      (secp256k1_ge *)local_40a8,(secp256k1_scalar *)local_4108);
  if (iVar13 != 0) goto LAB_0015b990;
  local_4158 = ZEXT816(1);
  auStack_4148 = ZEXT816(0);
  secp256k1_scalar_verify((secp256k1_scalar *)local_4158);
  local_40a8._16_8_ = (_func_void_char_ptr_void_ptr *)0x0;
  local_40a8._24_8_ = (void *)0x0;
  local_40a8._0_8_ = (_func_void_char_ptr_void_ptr *)0x0;
  local_40a8._8_8_ = (void *)0x0;
  secp256k1_scalar_verify((secp256k1_scalar *)local_40a8);
  local_40f8 = 0;
  uStack_40f0 = 0;
  _local_4108 = ZEXT816(0);
  secp256k1_scalar_verify((secp256k1_scalar *)local_4108);
  iVar13 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_4038,&DAT_00189980,0x21);
  if (iVar13 == 0) goto LAB_0015b995;
  iVar13 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4108,(secp256k1_scalar *)local_4158,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_40a8);
  if (iVar13 != 0) goto LAB_0015b99a;
  psVar18 = (secp256k1_context *)local_40a8;
  local_40a8._8_8_ = (void *)0x0;
  local_40a8._16_8_ = (_func_void_char_ptr_void_ptr *)0x0;
  local_40a8._24_8_ = (void *)0x0;
  local_40a8._0_8_ = (_func_void_char_ptr_void_ptr *)0x2;
  local_40a8[0x20] = '\x01';
  auStack_4128 = ZEXT816(0);
  _local_4138 = ZEXT816(0);
  secp256k1_scalar_verify((secp256k1_scalar *)local_4138);
  local_40f8 = 0;
  uStack_40f0 = 0;
  _local_4108 = ZEXT816(0);
  secp256k1_scalar_verify((secp256k1_scalar *)local_4108);
  local_4158 = ZEXT816(1);
  auStack_4148 = ZEXT816(0);
  secp256k1_scalar_verify((secp256k1_scalar *)local_4158);
  iVar13 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_4038,(uchar *)psVar18,0x21);
  if (iVar13 == 0) goto LAB_0015b99f;
  iVar13 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4158,(secp256k1_scalar *)local_4138,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_4108);
  if (iVar13 != 0) goto LAB_0015b9a4;
  psVar18 = (secp256k1_context *)local_4108;
  local_40f8 = 0;
  uStack_40f0 = 0;
  stack0xffffffffffffbef9 = ZEXT715(0);
  local_4108[0] = 2;
  local_40e8 = '\x02';
  psVar22 = (secp256k1_context *)0x2;
  local_4178._0_8_ = (_func_void_char_ptr_void_ptr *)0x2;
  local_4178._8_8_ = (void *)0x0;
  local_4178._16_8_ = 0;
  local_4178._24_8_ = 0;
  secp256k1_scalar_verify((secp256k1_scalar *)local_4178);
  auStack_4148 = ZEXT816(0);
  local_4158 = ZEXT816(0);
  secp256k1_scalar_verify((secp256k1_scalar *)local_4158);
  _local_4138 = ZEXT816(2);
  auStack_4128 = ZEXT816(0);
  secp256k1_scalar_verify((secp256k1_scalar *)local_4138);
  iVar13 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_4038,(uchar *)psVar18,0x21);
  if (iVar13 == 0) goto LAB_0015b9a9;
  iVar13 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_40a8,&DAT_001899b0,0x21);
  if (iVar13 == 0) goto LAB_0015b9ae;
  iVar13 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4138,(secp256k1_scalar *)local_4178,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_4158);
  if (iVar13 == 0) goto LAB_0015b9b3;
  iVar13 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4138,(secp256k1_scalar *)local_4178,
                      (secp256k1_ge *)local_40a8,(secp256k1_scalar *)local_4158);
  if (iVar13 == 0) goto LAB_0015b9b8;
  psVar18 = (secp256k1_context *)local_4178;
  secp256k1_scalar_negate((secp256k1_scalar *)psVar18,(secp256k1_scalar *)psVar18);
  iVar13 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4138,(secp256k1_scalar *)psVar18,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_4158);
  if (iVar13 == 0) goto LAB_0015b9bd;
  iVar13 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4138,(secp256k1_scalar *)local_4178,
                      (secp256k1_ge *)local_40a8,(secp256k1_scalar *)local_4158);
  if (iVar13 == 0) goto LAB_0015b9c2;
  local_4178._0_8_ = (_func_void_char_ptr_void_ptr *)0x1;
  local_4178._8_8_ = (void *)0x0;
  local_4178._16_8_ = 0;
  local_4178._24_8_ = 0;
  psVar18 = (secp256k1_context *)local_4178;
  secp256k1_scalar_verify((secp256k1_scalar *)psVar18);
  iVar13 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4138,(secp256k1_scalar *)psVar18,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_4158);
  if (iVar13 != 0) goto LAB_0015b9c7;
  iVar13 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4138,(secp256k1_scalar *)local_4178,
                      (secp256k1_ge *)local_40a8,(secp256k1_scalar *)local_4158);
  if (iVar13 != 0) goto LAB_0015b9cc;
  psVar18 = (secp256k1_context *)0x1;
  _local_4138 = ZEXT816(1);
  psVar22 = (secp256k1_context *)0x0;
  auStack_4128 = ZEXT816(0);
  secp256k1_scalar_verify((secp256k1_scalar *)local_4138);
  _local_4108 = ZEXT816(1);
  local_40f8 = 0;
  uStack_40f0 = 0;
  secp256k1_scalar_verify((secp256k1_scalar *)local_4108);
  secp256k1_scalar_set_b32((secp256k1_scalar *)local_4158,"",(int *)0x0);
  iVar13 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_4038,&DAT_001899e0,0x21);
  if (iVar13 == 0) goto LAB_0015b9d1;
  iVar13 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_40a8,&DAT_00189a10,0x21);
  if (iVar13 == 0) goto LAB_0015b9d6;
  iVar13 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4158,(secp256k1_scalar *)local_4138,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_4108);
  if (iVar13 == 0) goto LAB_0015b9db;
  iVar13 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4158,(secp256k1_scalar *)local_4138,
                      (secp256k1_ge *)local_40a8,(secp256k1_scalar *)local_4108);
  if (iVar13 == 0) goto LAB_0015b9e0;
  psVar18 = (secp256k1_context *)local_4138;
  secp256k1_scalar_negate((secp256k1_scalar *)psVar18,(secp256k1_scalar *)psVar18);
  iVar13 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4158,(secp256k1_scalar *)psVar18,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_4108);
  if (iVar13 == 0) goto LAB_0015b9e5;
  iVar13 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4158,(secp256k1_scalar *)local_4138,
                      (secp256k1_ge *)local_40a8,(secp256k1_scalar *)local_4108);
  if (iVar13 == 0) goto LAB_0015b9ea;
  _local_4138 = ZEXT816(2);
  auStack_4128 = ZEXT816(0);
  psVar18 = (secp256k1_context *)local_4138;
  secp256k1_scalar_verify((secp256k1_scalar *)psVar18);
  secp256k1_scalar_inverse_var((secp256k1_scalar *)psVar18,(secp256k1_scalar *)psVar18);
  iVar13 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4158,(secp256k1_scalar *)psVar18,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_4108);
  if (iVar13 != 0) goto LAB_0015b9ef;
  iVar13 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4158,(secp256k1_scalar *)local_4138,
                      (secp256k1_ge *)local_40a8,(secp256k1_scalar *)local_4108);
  if (iVar13 != 0) goto LAB_0015b9f4;
  psVar22 = (secp256k1_context *)0x1;
  local_4158 = ZEXT816(1);
  auStack_4148 = ZEXT816(0);
  secp256k1_scalar_verify((secp256k1_scalar *)local_4158);
  psVar18 = (secp256k1_context *)local_40a8;
  local_40a8._0_8_ = (_func_void_char_ptr_void_ptr *)0x1;
  local_40a8._8_8_ = (void *)0x0;
  local_40a8._16_8_ = (_func_void_char_ptr_void_ptr *)0x0;
  local_40a8._24_8_ = (void *)0x0;
  secp256k1_scalar_verify((secp256k1_scalar *)psVar18);
  secp256k1_scalar_negate((secp256k1_scalar *)psVar18,(secp256k1_scalar *)psVar18);
  secp256k1_scalar_set_b32((secp256k1_scalar *)local_4108,"",(int *)0x0);
  iVar13 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)local_4038,&DAT_00189a40,0x21);
  if (iVar13 == 0) goto LAB_0015b9f9;
  iVar13 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4108,(secp256k1_scalar *)local_4158,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_40a8);
  if (iVar13 == 0) goto LAB_0015b9fe;
  psVar18 = (secp256k1_context *)local_4158;
  secp256k1_scalar_negate((secp256k1_scalar *)psVar18,(secp256k1_scalar *)psVar18);
  iVar13 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4108,(secp256k1_scalar *)psVar18,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_40a8);
  if (iVar13 == 0) goto LAB_0015ba03;
  local_4158 = ZEXT816(3);
  auStack_4148 = ZEXT816(0);
  psVar22 = (secp256k1_context *)local_4158;
  secp256k1_scalar_verify((secp256k1_scalar *)psVar22);
  secp256k1_scalar_inverse_var((secp256k1_scalar *)psVar22,(secp256k1_scalar *)psVar22);
  psVar18 = (secp256k1_context *)local_4108;
  iVar13 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)psVar18,(secp256k1_scalar *)psVar22,
                      (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_40a8);
  if (iVar13 != 0) goto LAB_0015ba08;
  auStack_4148 = ZEXT816((ulong)0x100000000000000) << 0x40;
  local_4158 = ZEXT816(0);
  auStack_4128._8_8_ = 0xa9293eb931dddf65;
  auStack_4128._0_8_ = 0x62777a810be012b8;
  uStack_4130 = 0xf7f478316a9d5faa;
  local_4138 = (undefined1  [8])0x5344230681994186;
  iVar13 = secp256k1_ecdsa_sign
                     (CTX,(secp256k1_ecdsa_signature *)local_40a8,local_4138,local_4158,
                      precomputed_nonce_function,"");
  if (iVar13 != 0) goto LAB_0015ba0d;
  iVar13 = secp256k1_ecdsa_sign
                     (CTX,(secp256k1_ecdsa_signature *)local_40a8,local_4138,local_4158,
                      precomputed_nonce_function,test_ecdsa_edge_cases::nonce2);
  if (iVar13 != 0) goto LAB_0015ba12;
  auStack_4128[0xf] = 0xaa;
  iVar13 = secp256k1_ecdsa_sign
                     (CTX,(secp256k1_ecdsa_signature *)local_40a8,local_4138,local_4158,
                      precomputed_nonce_function,"");
  psVar14 = CTX;
  if (iVar13 != 1) goto LAB_0015ba17;
  auVar7._12_4_ = 0;
  auVar7._0_12_ = auStack_4104;
  _local_4108 = auVar7 << 0x20;
  local_4038[0].x.n[0] = (uint64_t)(CTX->illegal_callback).fn;
  local_4038[0].x.n[1] = (uint64_t)(CTX->illegal_callback).data;
  psVar22 = &secp256k1_context_static_;
  if (CTX == &secp256k1_context_static_) goto LAB_0015ba1c;
  (CTX->illegal_callback).fn = counting_callback_fn;
  (psVar14->illegal_callback).data = psVar18;
LAB_0015a5ed:
  iVar13 = secp256k1_ecdsa_sign
                     (CTX,(secp256k1_ecdsa_signature *)0x0,local_4138,local_4158,
                      precomputed_nonce_function,test_ecdsa_edge_cases::nonce2);
  psVar14 = CTX;
  if (iVar13 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
    (psVar14->illegal_callback).data = (void *)local_4038[0].x.n[1];
    if (local_4108 != (undefined1  [4])0x1) goto LAB_0015ba3a;
    auVar8._12_4_ = 0;
    auVar8._0_12_ = auStack_4104;
    _local_4108 = auVar8 << 0x20;
    local_4038[0].x.n[0] = (uint64_t)(psVar14->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(psVar14->illegal_callback).data;
    if (psVar14 == psVar22) goto LAB_0015ba3f;
    (psVar14->illegal_callback).fn = counting_callback_fn;
    (psVar14->illegal_callback).data = psVar18;
  }
  else {
    test_ecdsa_edge_cases_cold_12();
LAB_0015ba3a:
    test_ecdsa_edge_cases_cold_13();
    psVar14 = extraout_RAX_00;
LAB_0015ba3f:
    (*(psVar14->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar14->illegal_callback).data);
  }
  iVar13 = secp256k1_ecdsa_sign
                     (CTX,(secp256k1_ecdsa_signature *)local_40a8,(uchar *)0x0,local_4158,
                      precomputed_nonce_function,test_ecdsa_edge_cases::nonce2);
  psVar14 = CTX;
  if (iVar13 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
    (psVar14->illegal_callback).data = (void *)local_4038[0].x.n[1];
    if (local_4108 != (undefined1  [4])0x1) goto LAB_0015ba5d;
    auVar9._12_4_ = 0;
    auVar9._0_12_ = auStack_4104;
    _local_4108 = auVar9 << 0x20;
    local_4038[0].x.n[0] = (uint64_t)(psVar14->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(psVar14->illegal_callback).data;
    if (psVar14 == psVar22) goto LAB_0015ba62;
    (psVar14->illegal_callback).fn = counting_callback_fn;
    (psVar14->illegal_callback).data = psVar18;
  }
  else {
    test_ecdsa_edge_cases_cold_14();
LAB_0015ba5d:
    test_ecdsa_edge_cases_cold_15();
    psVar14 = extraout_RAX_01;
LAB_0015ba62:
    (*(psVar14->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar14->illegal_callback).data);
  }
  msg32 = precomputed_nonce_function;
  iVar13 = secp256k1_ecdsa_sign
                     (CTX,(secp256k1_ecdsa_signature *)local_40a8,local_4138,(uchar *)0x0,
                      precomputed_nonce_function,test_ecdsa_edge_cases::nonce2);
  psVar18 = CTX;
  if (iVar13 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
    (psVar18->illegal_callback).data = (void *)local_4038[0].x.n[1];
    if (local_4108 != (undefined1  [4])0x1) goto LAB_0015ba80;
    msg32 = precomputed_nonce_function;
    iVar13 = secp256k1_ecdsa_sign
                       (psVar18,(secp256k1_ecdsa_signature *)local_40a8,local_4138,local_4158,
                        precomputed_nonce_function,test_ecdsa_edge_cases::nonce2);
    if (iVar13 != 1) goto LAB_0015ba85;
    iVar13 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)local_4108,local_4158);
    psVar18 = CTX;
    if (iVar13 == 0) goto LAB_0015ba8a;
    local_4178._0_8_ = local_4178._0_8_ & 0xffffffff00000000;
    local_4038[0].x.n[0] = (uint64_t)(CTX->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(CTX->illegal_callback).data;
    if (CTX == psVar22) goto LAB_0015ba8f;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar18->illegal_callback).data = local_4178;
  }
  else {
    test_ecdsa_edge_cases_cold_16();
LAB_0015ba80:
    test_ecdsa_edge_cases_cold_17();
LAB_0015ba85:
    test_ecdsa_edge_cases_cold_18();
LAB_0015ba8a:
    test_ecdsa_edge_cases_cold_84();
    psVar18 = extraout_RAX_02;
LAB_0015ba8f:
    (*(psVar18->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar18->illegal_callback).data);
  }
  iVar13 = secp256k1_ecdsa_verify
                     (CTX,(secp256k1_ecdsa_signature *)0x0,local_4138,(secp256k1_pubkey *)local_4108
                     );
  psVar18 = CTX;
  if (iVar13 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
    (psVar18->illegal_callback).data = (void *)local_4038[0].x.n[1];
    if (local_4178._0_4_ != 1) goto LAB_0015baad;
    local_4178._0_8_ = local_4178._0_8_ & 0xffffffff00000000;
    local_4038[0].x.n[0] = (uint64_t)(psVar18->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(psVar18->illegal_callback).data;
    if (psVar18 == psVar22) goto LAB_0015bab2;
    (psVar18->illegal_callback).fn = counting_callback_fn;
    (psVar18->illegal_callback).data = local_4178;
  }
  else {
    test_ecdsa_edge_cases_cold_19();
LAB_0015baad:
    test_ecdsa_edge_cases_cold_20();
    psVar18 = extraout_RAX_03;
LAB_0015bab2:
    (*(psVar18->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar18->illegal_callback).data);
  }
  iVar13 = secp256k1_ecdsa_verify
                     (CTX,(secp256k1_ecdsa_signature *)local_40a8,(uchar *)0x0,
                      (secp256k1_pubkey *)local_4108);
  psVar18 = CTX;
  if (iVar13 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
    (psVar18->illegal_callback).data = (void *)local_4038[0].x.n[1];
    if (local_4178._0_4_ != 1) goto LAB_0015bad0;
    local_4178._0_8_ = local_4178._0_8_ & 0xffffffff00000000;
    local_4038[0].x.n[0] = (uint64_t)(psVar18->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(psVar18->illegal_callback).data;
    if (psVar18 == psVar22) goto LAB_0015bad5;
    (psVar18->illegal_callback).fn = counting_callback_fn;
    (psVar18->illegal_callback).data = local_4178;
  }
  else {
    test_ecdsa_edge_cases_cold_21();
LAB_0015bad0:
    test_ecdsa_edge_cases_cold_22();
    psVar18 = extraout_RAX_04;
LAB_0015bad5:
    (*(psVar18->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar18->illegal_callback).data);
  }
  iVar13 = secp256k1_ecdsa_verify
                     (CTX,(secp256k1_ecdsa_signature *)local_40a8,local_4138,(secp256k1_pubkey *)0x0
                     );
  psVar18 = CTX;
  if (iVar13 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
    (psVar18->illegal_callback).data = (void *)local_4038[0].x.n[1];
    if (local_4178._0_4_ != 1) goto LAB_0015baf3;
    iVar13 = secp256k1_ecdsa_verify
                       (psVar18,(secp256k1_ecdsa_signature *)local_40a8,local_4138,
                        (secp256k1_pubkey *)local_4108);
    psVar18 = CTX;
    if (iVar13 == 0) goto LAB_0015baf8;
    local_4178._0_8_ = local_4178._0_8_ & 0xffffffff00000000;
    local_4038[0].x.n[0] = (uint64_t)(CTX->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(CTX->illegal_callback).data;
    if (CTX == psVar22) goto LAB_0015bafd;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar18->illegal_callback).data = local_4178;
  }
  else {
    test_ecdsa_edge_cases_cold_23();
LAB_0015baf3:
    test_ecdsa_edge_cases_cold_24();
LAB_0015baf8:
    test_ecdsa_edge_cases_cold_83();
    psVar18 = extraout_RAX_05;
LAB_0015bafd:
    (*(psVar18->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar18->illegal_callback).data);
  }
  iVar13 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)local_4108,(uchar *)0x0);
  psVar18 = CTX;
  if (iVar13 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
    (psVar18->illegal_callback).data = (void *)local_4038[0].x.n[1];
    if (local_4178._0_4_ != 1) goto LAB_0015bb1b;
    local_4178._0_8_ = local_4178._0_8_ & 0xffffffff00000000;
    local_4038[0].x.n[0] = (uint64_t)(psVar18->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(psVar18->illegal_callback).data;
    if (psVar18 == psVar22) goto LAB_0015bb20;
    (psVar18->illegal_callback).fn = counting_callback_fn;
    (psVar18->illegal_callback).data = local_4178;
  }
  else {
    test_ecdsa_edge_cases_cold_25();
LAB_0015bb1b:
    test_ecdsa_edge_cases_cold_26();
    psVar18 = extraout_RAX_06;
LAB_0015bb20:
    (*(psVar18->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar18->illegal_callback).data);
  }
  iVar13 = secp256k1_ecdsa_verify
                     (CTX,(secp256k1_ecdsa_signature *)local_40a8,local_4138,
                      (secp256k1_pubkey *)local_4108);
  psVar18 = CTX;
  if (iVar13 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
    (psVar18->illegal_callback).data = (void *)local_4038[0].x.n[1];
    if (local_4178._0_4_ != 1) goto LAB_0015bb3e;
    local_40c8[0] = 0x48;
    local_4178._0_8_ = local_4178._0_8_ & 0xffffffff00000000;
    local_4038[0].x.n[0] = (uint64_t)(psVar18->illegal_callback).fn;
    local_4038[0].x.n[1] = (uint64_t)(psVar18->illegal_callback).data;
    if (psVar18 == psVar22) goto LAB_0015bb43;
    (psVar18->illegal_callback).fn = counting_callback_fn;
    (psVar18->illegal_callback).data = local_4178;
  }
  else {
    test_ecdsa_edge_cases_cold_27();
LAB_0015bb3e:
    test_ecdsa_edge_cases_cold_28();
    psVar18 = extraout_RAX_07;
LAB_0015bb43:
    (*(psVar18->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar18->illegal_callback).data);
  }
  iVar13 = secp256k1_ecdsa_signature_serialize_der
                     (CTX,(uchar *)0x0,local_40c8,(secp256k1_ecdsa_signature *)local_40a8);
  psVar18 = CTX;
  if (iVar13 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038[0].x.n[0];
    (psVar18->illegal_callback).data = (void *)local_4038[0].x.n[1];
    if (local_4178._0_4_ != 1) goto LAB_0015bb61;
    local_4180 = local_4180 & 0xffffffff00000000;
    local_4178._0_8_ = (psVar18->illegal_callback).fn;
    local_4178._8_8_ = (psVar18->illegal_callback).data;
    if (psVar18 == psVar22) goto LAB_0015bb66;
    (psVar18->illegal_callback).fn = counting_callback_fn;
    (psVar18->illegal_callback).data = &local_4180;
  }
  else {
    test_ecdsa_edge_cases_cold_29();
LAB_0015bb61:
    test_ecdsa_edge_cases_cold_30();
    psVar18 = extraout_RAX_08;
LAB_0015bb66:
    (*(psVar18->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar18->illegal_callback).data);
  }
  iVar13 = secp256k1_ecdsa_signature_serialize_der
                     (CTX,(uchar *)local_4038,(size_t *)0x0,(secp256k1_ecdsa_signature *)local_40a8)
  ;
  psVar18 = CTX;
  if (iVar13 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178._0_8_;
    (psVar18->illegal_callback).data = (void *)local_4178._8_8_;
    if ((int)local_4180 != 1) goto LAB_0015bb84;
    local_4180 = local_4180 & 0xffffffff00000000;
    local_4178._0_8_ = (psVar18->illegal_callback).fn;
    local_4178._8_8_ = (psVar18->illegal_callback).data;
    if (psVar18 == psVar22) goto LAB_0015bb89;
    (psVar18->illegal_callback).fn = counting_callback_fn;
    (psVar18->illegal_callback).data = &local_4180;
  }
  else {
    test_ecdsa_edge_cases_cold_31();
LAB_0015bb84:
    test_ecdsa_edge_cases_cold_32();
    psVar18 = extraout_RAX_09;
LAB_0015bb89:
    (*(psVar18->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar18->illegal_callback).data);
  }
  iVar13 = secp256k1_ecdsa_signature_serialize_der
                     (CTX,(uchar *)local_4038,local_40c8,(secp256k1_ecdsa_signature *)0x0);
  psVar18 = CTX;
  if (iVar13 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178._0_8_;
    (psVar18->illegal_callback).data = (void *)local_4178._8_8_;
    if ((int)local_4180 != 1) goto LAB_0015bba7;
    iVar13 = secp256k1_ecdsa_signature_serialize_der
                       (psVar18,(uchar *)local_4038,local_40c8,
                        (secp256k1_ecdsa_signature *)local_40a8);
    psVar18 = CTX;
    if (iVar13 == 0) goto LAB_0015bbac;
    local_4180 = local_4180 & 0xffffffff00000000;
    local_4178._0_8_ = (CTX->illegal_callback).fn;
    local_4178._8_8_ = (CTX->illegal_callback).data;
    if (CTX == psVar22) goto LAB_0015bbb1;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar18->illegal_callback).data = &local_4180;
  }
  else {
    test_ecdsa_edge_cases_cold_33();
LAB_0015bba7:
    test_ecdsa_edge_cases_cold_34();
LAB_0015bbac:
    test_ecdsa_edge_cases_cold_82();
    psVar18 = extraout_RAX_10;
LAB_0015bbb1:
    (*(psVar18->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar18->illegal_callback).data);
  }
  iVar13 = secp256k1_ecdsa_signature_parse_der
                     (CTX,(secp256k1_ecdsa_signature *)0x0,(uchar *)local_4038,local_40c8[0]);
  psVar18 = CTX;
  if (iVar13 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178._0_8_;
    (psVar18->illegal_callback).data = (void *)local_4178._8_8_;
    if ((int)local_4180 != 1) goto LAB_0015bbcf;
    local_4180 = local_4180 & 0xffffffff00000000;
    local_4178._0_8_ = (psVar18->illegal_callback).fn;
    local_4178._8_8_ = (psVar18->illegal_callback).data;
    if (psVar18 == psVar22) goto LAB_0015bbd4;
    (psVar18->illegal_callback).fn = counting_callback_fn;
    (psVar18->illegal_callback).data = &local_4180;
  }
  else {
    test_ecdsa_edge_cases_cold_35();
LAB_0015bbcf:
    test_ecdsa_edge_cases_cold_36();
    psVar18 = extraout_RAX_11;
LAB_0015bbd4:
    (*(psVar18->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar18->illegal_callback).data);
  }
  iVar13 = secp256k1_ecdsa_signature_parse_der
                     (CTX,(secp256k1_ecdsa_signature *)local_40a8,(uchar *)0x0,local_40c8[0]);
  psVar18 = CTX;
  if (iVar13 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178._0_8_;
    (psVar18->illegal_callback).data = (void *)local_4178._8_8_;
    if ((int)local_4180 != 1) goto LAB_0015bbf2;
    iVar13 = secp256k1_ecdsa_signature_parse_der
                       (psVar18,(secp256k1_ecdsa_signature *)local_40a8,(uchar *)local_4038,
                        local_40c8[0]);
    if (iVar13 == 0) goto LAB_0015bbf7;
    local_40c8[0] = 10;
    iVar13 = secp256k1_ecdsa_signature_serialize_der
                       (CTX,(uchar *)local_4038,local_40c8,(secp256k1_ecdsa_signature *)local_40a8);
    psVar18 = CTX;
    if (iVar13 != 0) goto LAB_0015bbfc;
    local_4180 = local_4180 & 0xffffffff00000000;
    local_4178._0_8_ = (CTX->illegal_callback).fn;
    local_4178._8_8_ = (CTX->illegal_callback).data;
    if (CTX == psVar22) goto LAB_0015bc01;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar18->illegal_callback).data = &local_4180;
  }
  else {
    test_ecdsa_edge_cases_cold_37();
LAB_0015bbf2:
    test_ecdsa_edge_cases_cold_38();
LAB_0015bbf7:
    test_ecdsa_edge_cases_cold_81();
LAB_0015bbfc:
    test_ecdsa_edge_cases_cold_39();
    psVar18 = extraout_RAX_12;
LAB_0015bc01:
    (*(psVar18->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar18->illegal_callback).data);
  }
  iVar13 = secp256k1_ecdsa_signature_normalize
                     (CTX,(secp256k1_ecdsa_signature *)0x0,(secp256k1_ecdsa_signature *)0x0);
  psVar18 = CTX;
  if (iVar13 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178._0_8_;
    (psVar18->illegal_callback).data = (void *)local_4178._8_8_;
    if ((int)local_4180 != 1) goto LAB_0015bc1f;
    local_4180 = local_4180 & 0xffffffff00000000;
    local_4178._0_8_ = (psVar18->illegal_callback).fn;
    local_4178._8_8_ = (psVar18->illegal_callback).data;
    if (psVar18 == psVar22) goto LAB_0015bc24;
    (psVar18->illegal_callback).fn = counting_callback_fn;
    (psVar18->illegal_callback).data = &local_4180;
  }
  else {
    test_ecdsa_edge_cases_cold_40();
LAB_0015bc1f:
    test_ecdsa_edge_cases_cold_41();
    psVar18 = extraout_RAX_13;
LAB_0015bc24:
    (*(psVar18->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar18->illegal_callback).data);
  }
  iVar13 = secp256k1_ecdsa_signature_serialize_compact
                     (CTX,(uchar *)0x0,(secp256k1_ecdsa_signature *)local_40a8);
  psVar18 = CTX;
  if (iVar13 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178._0_8_;
    (psVar18->illegal_callback).data = (void *)local_4178._8_8_;
    if ((int)local_4180 != 1) goto LAB_0015bc42;
    local_4180 = local_4180 & 0xffffffff00000000;
    local_4178._0_8_ = (psVar18->illegal_callback).fn;
    local_4178._8_8_ = (psVar18->illegal_callback).data;
    if (psVar18 == psVar22) goto LAB_0015bc47;
    (psVar18->illegal_callback).fn = counting_callback_fn;
    (psVar18->illegal_callback).data = &local_4180;
  }
  else {
    test_ecdsa_edge_cases_cold_42();
LAB_0015bc42:
    test_ecdsa_edge_cases_cold_43();
    psVar18 = extraout_RAX_14;
LAB_0015bc47:
    (*(psVar18->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar18->illegal_callback).data);
  }
  iVar13 = secp256k1_ecdsa_signature_serialize_compact
                     (CTX,(uchar *)local_4038,(secp256k1_ecdsa_signature *)0x0);
  psVar18 = CTX;
  if (iVar13 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178._0_8_;
    (psVar18->illegal_callback).data = (void *)local_4178._8_8_;
    if ((int)local_4180 != 1) goto LAB_0015bc65;
    iVar13 = secp256k1_ecdsa_signature_serialize_compact
                       (psVar18,(uchar *)local_4038,(secp256k1_ecdsa_signature *)local_40a8);
    psVar18 = CTX;
    if (iVar13 == 0) goto LAB_0015bc6a;
    local_4180 = local_4180 & 0xffffffff00000000;
    local_4178._0_8_ = (CTX->illegal_callback).fn;
    local_4178._8_8_ = (CTX->illegal_callback).data;
    if (CTX == psVar22) goto LAB_0015bc6f;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar18->illegal_callback).data = &local_4180;
  }
  else {
    test_ecdsa_edge_cases_cold_44();
LAB_0015bc65:
    test_ecdsa_edge_cases_cold_45();
LAB_0015bc6a:
    test_ecdsa_edge_cases_cold_80();
    psVar18 = extraout_RAX_15;
LAB_0015bc6f:
    (*(psVar18->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar18->illegal_callback).data);
  }
  iVar13 = secp256k1_ecdsa_signature_parse_compact
                     (CTX,(secp256k1_ecdsa_signature *)0x0,(uchar *)local_4038);
  psVar18 = CTX;
  if (iVar13 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178._0_8_;
    (psVar18->illegal_callback).data = (void *)local_4178._8_8_;
    if ((int)local_4180 != 1) goto LAB_0015bc8d;
    local_4180 = local_4180 & 0xffffffff00000000;
    local_4178._0_8_ = (psVar18->illegal_callback).fn;
    local_4178._8_8_ = (psVar18->illegal_callback).data;
    if (psVar18 == psVar22) goto LAB_0015bc92;
    (psVar18->illegal_callback).fn = counting_callback_fn;
    (psVar18->illegal_callback).data = &local_4180;
  }
  else {
    test_ecdsa_edge_cases_cold_46();
LAB_0015bc8d:
    test_ecdsa_edge_cases_cold_47();
    psVar18 = extraout_RAX_16;
LAB_0015bc92:
    (*(psVar18->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar18->illegal_callback).data);
  }
  psVar22 = CTX;
  iVar13 = secp256k1_ecdsa_signature_parse_compact
                     (CTX,(secp256k1_ecdsa_signature *)local_40a8,(uchar *)0x0);
  psVar18 = CTX;
  if (iVar13 == 0) {
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178._0_8_;
    (psVar18->illegal_callback).data = (void *)local_4178._8_8_;
    if ((int)local_4180 != 1) goto LAB_0015bcb0;
    iVar13 = secp256k1_ecdsa_signature_parse_compact
                       (psVar18,(secp256k1_ecdsa_signature *)local_40a8,(uchar *)local_4038);
    if (iVar13 == 0) goto LAB_0015bcb5;
    local_4038[0].y.n[0]._0_4_ = 0xffffffff;
    local_4038[0].y.n[0]._4_4_ = 0xffffffff;
    local_4038[0].y.n[1]._0_4_ = 0xffffffff;
    local_4038[0].y.n[1]._4_4_ = 0xffffffff;
    local_4038[0].x.n[4] = 0xffffffffffffffff;
    local_4038[0].x.magnitude = -1;
    local_4038[0].x.normalized = -1;
    local_4038[0].x.n[2] = 0xffffffffffffffff;
    local_4038[0].x.n[3] = 0xffffffffffffffff;
    local_4038[0].x.n[0] = 0xffffffffffffffff;
    local_4038[0].x.n[1] = 0xffffffffffffffff;
    psVar18 = CTX;
    iVar13 = secp256k1_ecdsa_signature_parse_compact
                       (CTX,(secp256k1_ecdsa_signature *)local_40a8,(uchar *)local_4038);
    if (iVar13 == 0) {
      psVar18 = (secp256k1_context *)local_4138;
      pvVar17 = (void *)0x0;
      do {
        psVar22 = (secp256k1_context *)local_4158;
        local_4110 = "";
        if ((int)pvVar17 == 0) {
          local_4110 = (uchar *)0x0;
        }
        _local_4138 = (undefined1  [16])0x0;
        auStack_4128._0_15_ = SUB1615((undefined1  [16])0x0,0);
        auStack_4128[0xf] = 1;
        local_4158._8_4_ = 0xffffffff;
        local_4158._0_8_ = 0xffffffffffffffff;
        local_4158._12_4_ = 0xffffffff;
        auStack_4148._8_4_ = 0xffffffff;
        auStack_4148._0_8_ = 0xffffffffffffffff;
        auStack_4148._12_4_ = 0xffffffff;
        local_40a8._104_8_ = pvVar17;
        iVar13 = secp256k1_ecdsa_sign
                           (CTX,(secp256k1_ecdsa_signature *)local_40a8,(uchar *)psVar18,
                            (uchar *)psVar22,(secp256k1_nonce_function)0x0,local_4110);
        if (iVar13 != 0) goto LAB_0015b94a;
        lVar15 = 0;
        do {
          cVar12 = local_40a8[lVar15];
          if (cVar12 != '\0') goto LAB_0015b0b0;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x40);
        cVar12 = '\0';
LAB_0015b0b0:
        if (cVar12 != '\0') goto LAB_0015b94f;
        auStack_4148 = (undefined1  [16])0x0;
        local_4158 = (undefined1  [16])0x0;
        iVar13 = secp256k1_ecdsa_sign
                           (CTX,(secp256k1_ecdsa_signature *)local_40a8,(uchar *)psVar18,
                            (uchar *)psVar22,(secp256k1_nonce_function)0x0,local_4110);
        if (iVar13 != 0) goto LAB_0015b954;
        lVar15 = 0;
        do {
          cVar12 = local_40a8[lVar15];
          if (cVar12 != '\0') goto LAB_0015b105;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x40);
        cVar12 = '\0';
LAB_0015b105:
        if (cVar12 != '\0') goto LAB_0015b959;
        auStack_4148[0xf] = 1;
        iVar13 = secp256k1_ecdsa_sign
                           (CTX,(secp256k1_ecdsa_signature *)local_40a8,(uchar *)psVar18,
                            (uchar *)psVar22,nonce_function_test_fail,local_4110);
        if (iVar13 != 0) goto LAB_0015b95e;
        lVar15 = 0;
        do {
          cVar12 = local_40a8[lVar15];
          if (cVar12 != '\0') goto LAB_0015b157;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x40);
        cVar12 = '\0';
LAB_0015b157:
        if (cVar12 != '\0') goto LAB_0015b963;
        iVar13 = secp256k1_ecdsa_sign
                           (CTX,(secp256k1_ecdsa_signature *)local_40a8,(uchar *)psVar18,
                            (uchar *)psVar22,nonce_function_test_retry,local_4110);
        if (iVar13 != 1) goto LAB_0015b968;
        lVar15 = 0;
        do {
          cVar12 = local_40a8[lVar15];
          if (cVar12 != '\0') goto LAB_0015b1a5;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x40);
        cVar12 = '\0';
LAB_0015b1a5:
        if (cVar12 == '\0') goto LAB_0015b96d;
        iVar13 = secp256k1_ecdsa_sign
                           (CTX,(secp256k1_ecdsa_signature *)local_4108,(uchar *)psVar18,
                            (uchar *)psVar22,nonce_function_rfc6979,local_4110);
        if (iVar13 != 1) goto LAB_0015b972;
        lVar15 = 0;
        do {
          cVar12 = local_4108[lVar15];
          if (cVar12 != '\0') goto LAB_0015b1f8;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x40);
        cVar12 = '\0';
LAB_0015b1f8:
        if (cVar12 == '\0') goto LAB_0015b977;
        lVar15 = 0;
        do {
          iVar13 = (uint)(byte)local_40a8[lVar15] - (uint)(byte)local_4108[lVar15];
          if (local_40a8[lVar15] != local_4108[lVar15]) goto LAB_0015b22b;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x40);
        iVar13 = 0;
LAB_0015b22b:
        if (iVar13 != 0) goto LAB_0015b97c;
        iVar13 = secp256k1_ecdsa_sign
                           (CTX,(secp256k1_ecdsa_signature *)local_4108,(uchar *)psVar18,
                            (uchar *)psVar22,(secp256k1_nonce_function)0x0,local_4110);
        if (iVar13 != 1) goto LAB_0015b981;
        lVar15 = 0;
        do {
          cVar12 = local_4108[lVar15];
          if (cVar12 != '\0') goto LAB_0015b27a;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x40);
        cVar12 = '\0';
LAB_0015b27a:
        if (cVar12 == '\0') goto LAB_0015b986;
        lVar15 = 0;
        do {
          iVar13 = (uint)(byte)local_40a8[lVar15] - (uint)(byte)local_4108[lVar15];
          if (local_40a8[lVar15] != local_4108[lVar15]) goto LAB_0015b2ad;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x40);
        iVar13 = 0;
LAB_0015b2ad:
        if (iVar13 != 0) goto LAB_0015b98b;
        lVar15 = 0;
        do {
          local_4138[0] = (char)lVar15;
          iVar13 = secp256k1_ecdsa_sign
                             (CTX,(secp256k1_ecdsa_signature *)local_4108,(uchar *)psVar18,
                              (uchar *)psVar22,(secp256k1_nonce_function)0x0,local_4110);
          psVar14 = psVar18;
          if (iVar13 != 1) goto LAB_0015b936;
          lVar16 = 0;
          do {
            cVar12 = local_4108[lVar16];
            if (cVar12 != '\0') goto LAB_0015b304;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 0x40);
          cVar12 = '\0';
LAB_0015b304:
          if (cVar12 == '\0') goto LAB_0015b93b;
          local_4038[0].x.n[lVar15 * 4 + 2] = local_40f8;
          local_4038[0].x.n[lVar15 * 4 + 3] = uStack_40f0;
          local_4038[0].x.n[lVar15 * 4] = _local_4108;
          local_4038[0].x.n[lVar15 * 4 + 1] = auStack_4104._4_8_;
          if (lVar15 != 0) {
            puVar19 = local_4038[0].x.n + lVar15 * 4;
            r = local_4038;
            lVar16 = lVar15;
            do {
              secp256k1_scalar_verify((secp256k1_scalar *)puVar19);
              secp256k1_scalar_verify((secp256k1_scalar *)r);
              if ((((*puVar19 == (r->x).n[0]) && (local_4038[0].x.n[lVar15 * 4 + 1] == (r->x).n[1]))
                  && (local_4038[0].x.n[lVar15 * 4 + 2] == (r->x).n[2])) &&
                 (local_4038[0].x.n[lVar15 * 4 + 3] == (r->x).n[3])) goto LAB_0015b931;
              r = (secp256k1_gej *)((r->x).n + 4);
              lVar16 = lVar16 + -1;
            } while (lVar16 != 0);
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x100);
        auVar10[0xf] = 0;
        auVar10._0_15_ = stack0xffffffffffffbec9;
        _local_4138 = auVar10 << 8;
        auStack_4128[0xf] = 2;
        lVar15 = 0x100;
        psVar21 = (secp256k1_context *)0x2000;
        do {
          psVar22 = (secp256k1_context *)local_4158;
          local_4158[0] = (char)lVar15;
          iVar13 = secp256k1_ecdsa_sign
                             (CTX,(secp256k1_ecdsa_signature *)local_4108,(uchar *)psVar18,
                              (uchar *)psVar22,(secp256k1_nonce_function)0x0,local_4110);
          if (iVar13 != 1) goto LAB_0015b940;
          lVar16 = 0;
          do {
            cVar12 = local_4108[lVar16];
            if (cVar12 != '\0') goto LAB_0015b407;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 0x40);
          cVar12 = '\0';
LAB_0015b407:
          if (cVar12 == '\0') goto LAB_0015b945;
          puVar19 = local_4038[0].x.n + lVar15 * 4;
          local_4038[0].x.n[lVar15 * 4 + 2] = local_40f8;
          local_4038[0].x.n[lVar15 * 4 + 3] = uStack_40f0;
          *puVar19 = _local_4108;
          local_4038[0].x.n[lVar15 * 4 + 1] = auStack_4104._4_8_;
          psVar14 = (secp256k1_context *)0x0;
          do {
            r_00 = (secp256k1_scalar *)
                   ((long)local_4038[0].x.n +
                   (long)(&(psVar14->ecmult_gen_ctx).scalar_offset + -1) + 0x18);
            secp256k1_scalar_verify((secp256k1_scalar *)puVar19);
            secp256k1_scalar_verify(r_00);
            if (((*puVar19 == r_00->d[0]) &&
                (local_4038[0].x.n[lVar15 * 4 + 1] ==
                 *(uint64_t *)((long)(local_4038[0].x.n + 1) + (long)psVar14))) &&
               ((local_4038[0].x.n[lVar15 * 4 + 2] ==
                 *(uint64_t *)((long)(local_4038[0].x.n + 2) + (long)psVar14) &&
                (local_4038[0].x.n[lVar15 * 4 + 3] ==
                 *(uint64_t *)((long)(local_4038[0].x.n + 3) + (long)psVar14))))) {
              test_ecdsa_edge_cases_cold_65();
              psVar22 = psVar18;
LAB_0015b931:
              test_ecdsa_edge_cases_cold_63();
              goto LAB_0015b936;
            }
            psVar14 = (secp256k1_context *)((psVar14->ecmult_gen_ctx).scalar_offset.d + 3);
          } while (psVar21 != psVar14);
          lVar15 = lVar15 + 1;
          psVar21 = (secp256k1_context *)((psVar21->ecmult_gen_ctx).scalar_offset.d + 3);
        } while (lVar15 != 0x200);
        pvVar17 = (void *)(ulong)((int)local_40a8._104_8_ + 1);
      } while ((int)local_40a8._104_8_ == 0);
      msg32 = (code *)local_4108;
      local_40f8 = 0;
      uStack_40f0 = 0;
      _local_4108 = (undefined1  [16])0x0;
      lVar15 = 0;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uStack_4130;
      _local_4138 = auVar11 << 0x40;
      local_4178._0_8_ = (_func_void_char_ptr_void_ptr *)0x0;
      local_40c8[0] = 0;
      local_4038[0].x.n[0] = 0x4d430001;
      local_4038[0].x.n[1] = (uint64_t)local_40c8;
      local_4038[0].x.n[2] = 0x20;
      local_4038[0].x.n[3] = 0;
      local_4038[0].x.n[4] = 0;
      local_4038[0].x.magnitude = 0;
      local_4038[0].x.normalized = 0;
      local_4180 = 0;
      nonce_function_rfc6979(local_4158,(uchar *)msg32,(uchar *)msg32,(uchar *)0x0,(void *)0x0,0);
      local_4038[0].x.n[0] = 0x4d430005;
      local_4038[0].x.n[2] = 0x20;
      local_4038[0].x.n[3] = 0;
      local_4038[0].x.n[4] = 0;
      local_4038[0].x.magnitude = 0;
      local_4038[0].x.normalized = 0;
      local_4180 = 0;
      local_4038[0].x.n[1] = (uint64_t)local_4158;
      nonce_function_rfc6979
                ((uchar *)psVar18,(uchar *)msg32,(uchar *)msg32,(uchar *)msg32,(void *)0x0,0);
      local_4038[0].x.n[0] = 0x4d430005;
      local_4038[0].x.n[2] = 0x20;
      local_4038[0].x.n[3] = 0;
      local_4038[0].x.n[4] = 0;
      local_4038[0].x.magnitude = 0;
      local_4038[0].x.normalized = 0;
      local_4180 = 0;
      local_4038[0].x.n[1] = (uint64_t)psVar18;
      nonce_function_rfc6979(local_4178,(uchar *)msg32,(uchar *)msg32,(uchar *)0x0,msg32,0);
      local_4038[0].x.n[0] = 0x4d430005;
      local_4038[0].x.n[2] = 0x20;
      local_4038[0].x.n[3] = 0;
      local_4038[0].x.n[4] = 0;
      local_4038[0].x.magnitude = 0;
      local_4038[0].x.normalized = 0;
      local_4180 = 0;
      psVar20 = local_40c8;
      local_4038[0].x.n[1] = (uint64_t)local_4178;
      nonce_function_rfc6979
                ((uchar *)local_40c8,(uchar *)msg32,(uchar *)msg32,(uchar *)msg32,msg32,0);
      local_4038[0].x.n[0] = 0x4d430005;
      local_4038[0].x.n[1] = (uint64_t)local_40c8;
      local_4038[0].x.n[2] = 0x20;
      local_4038[0].x.n[3] = 0;
      local_4038[0].x.n[4] = 0;
      local_4038[0].x.magnitude = 0;
      local_4038[0].x.normalized = 0;
      uVar2 = (ulong)((long)psVar20 << 3) >> 0x33;
      uVar3 = (((long)psVar20 << 3 | (ulong)psVar20 >> 0x3d) << 0xd | uVar2) >> 3;
      psVar18 = (secp256k1_context *)(uVar3 << 0x33 | (uVar2 << 0x3d | uVar3) >> 0xd);
      local_4180 = 0;
      do {
        iVar13 = (uint)(byte)local_4158[lVar15] - (uint)(byte)local_4138[lVar15];
        if (local_4158[lVar15] != local_4138[lVar15]) goto LAB_0015b7aa;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 0x20);
      iVar13 = 0;
LAB_0015b7aa:
      if (iVar13 == 0) {
LAB_0015bcbf:
        test_ecdsa_edge_cases_cold_73();
LAB_0015bcc4:
        test_ecdsa_edge_cases_cold_72();
LAB_0015bcc9:
        test_ecdsa_edge_cases_cold_71();
LAB_0015bcce:
        test_ecdsa_edge_cases_cold_70();
LAB_0015bcd3:
        test_ecdsa_edge_cases_cold_69();
LAB_0015bcd8:
        test_ecdsa_edge_cases_cold_68();
      }
      else {
        lVar15 = 0;
        do {
          bVar1 = local_4178[lVar15];
          psVar18 = (secp256k1_context *)(ulong)bVar1;
          iVar13 = (uint)(byte)local_4158[lVar15] - (uint)bVar1;
          if (local_4158[lVar15] != bVar1) goto LAB_0015b7d7;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x20);
        iVar13 = 0;
LAB_0015b7d7:
        if (iVar13 == 0) goto LAB_0015bcc4;
        lVar15 = 0;
        do {
          bVar1 = *(byte *)((long)local_40c8 + lVar15);
          psVar18 = (secp256k1_context *)(ulong)bVar1;
          iVar13 = (uint)(byte)local_4158[lVar15] - (uint)bVar1;
          if (local_4158[lVar15] != bVar1) goto LAB_0015b807;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x20);
        iVar13 = 0;
LAB_0015b807:
        if (iVar13 == 0) goto LAB_0015bcc9;
        lVar15 = 0;
        do {
          bVar1 = local_4178[lVar15];
          psVar18 = (secp256k1_context *)(ulong)bVar1;
          iVar13 = (uint)(byte)local_4138[lVar15] - (uint)bVar1;
          if (local_4138[lVar15] != bVar1) goto LAB_0015b834;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x20);
        iVar13 = 0;
LAB_0015b834:
        if (iVar13 == 0) goto LAB_0015bcce;
        lVar15 = 0;
        do {
          bVar1 = *(byte *)((long)local_40c8 + lVar15);
          psVar18 = (secp256k1_context *)(ulong)bVar1;
          iVar13 = (uint)(byte)local_4138[lVar15] - (uint)bVar1;
          if (local_4138[lVar15] != bVar1) goto LAB_0015b864;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x20);
        iVar13 = 0;
LAB_0015b864:
        if (iVar13 == 0) goto LAB_0015bcd3;
        lVar15 = 0;
        do {
          bVar1 = *(byte *)((long)local_40c8 + lVar15);
          psVar18 = (secp256k1_context *)(ulong)bVar1;
          iVar13 = (uint)(byte)local_4178[lVar15] - (uint)bVar1;
          if (local_4178[lVar15] != bVar1) goto LAB_0015b894;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x20);
        iVar13 = 0;
LAB_0015b894:
        if (iVar13 == 0) goto LAB_0015bcd8;
        local_40f8._0_1_ = 0xba;
        local_40f8._1_1_ = 0xae;
        local_40f8._2_1_ = 0xdc;
        local_40f8._3_1_ = 0xe6;
        local_40f8._4_1_ = 0xaf;
        local_40f8._5_1_ = 'H';
        local_40f8._6_1_ = 0xa0;
        local_40f8._7_1_ = ';';
        uStack_40f0._0_1_ = 0xbf;
        uStack_40f0._1_1_ = 0xd2;
        uStack_40f0._2_1_ = '^';
        uStack_40f0._3_1_ = 0x8c;
        uStack_40f0._4_1_ = 0xd0;
        uStack_40f0._5_1_ = '6';
        uStack_40f0._6_1_ = 'A';
        uStack_40f0._7_1_ = 'A';
        auStack_4104[4] = 0xff;
        auStack_4104[5] = 0xff;
        auStack_4104[6] = 0xff;
        auStack_4104[7] = 0xff;
        auStack_4104[8] = 0xff;
        auStack_4104[9] = 0xff;
        auStack_4104[10] = 0xff;
        auStack_4104[0xb] = 0xfe;
        local_4108[0] = 0xff;
        local_4108[1] = 0xff;
        local_4108[2] = 0xff;
        local_4108[3] = 0xff;
        auStack_4104[0] = 0xff;
        auStack_4104[1] = 0xff;
        auStack_4104[2] = 0xff;
        auStack_4104[3] = 0xff;
        local_4158._0_8_ = 300;
        msg32 = (code *)0x0;
        psVar18 = CTX;
        iVar13 = ec_privkey_export_der(CTX,(uchar *)local_4038,(size_t *)local_4158,local_4108,0);
        if (iVar13 == 0) {
          local_4158._0_8_ = 300;
          msg32 = (code *)0x1;
          psVar18 = CTX;
          iVar13 = ec_privkey_export_der(CTX,(uchar *)local_4038,(size_t *)local_4158,local_4108,1);
          if (iVar13 == 0) {
            return;
          }
          goto LAB_0015bce2;
        }
      }
      test_ecdsa_edge_cases_cold_66();
LAB_0015bce2:
      test_ecdsa_edge_cases_cold_67();
      uVar4 = *(undefined8 *)msg32;
      uVar5 = *(uint64_t *)(msg32 + 8);
      uVar6 = *(uint64_t *)(msg32 + 0x18);
      (psVar18->ecmult_gen_ctx).scalar_offset.d[1] = *(uint64_t *)(msg32 + 0x10);
      (psVar18->ecmult_gen_ctx).scalar_offset.d[2] = uVar6;
      *(undefined8 *)&psVar18->ecmult_gen_ctx = uVar4;
      (psVar18->ecmult_gen_ctx).scalar_offset.d[0] = uVar5;
      return;
    }
  }
  else {
    test_ecdsa_edge_cases_cold_48();
    psVar18 = psVar22;
LAB_0015bcb0:
    test_ecdsa_edge_cases_cold_49();
LAB_0015bcb5:
    test_ecdsa_edge_cases_cold_79();
  }
  test_ecdsa_edge_cases_cold_50();
  goto LAB_0015bcbf;
LAB_0015b936:
  test_ecdsa_edge_cases_cold_62();
  psVar18 = psVar14;
LAB_0015b93b:
  test_ecdsa_edge_cases_cold_75();
LAB_0015b940:
  test_ecdsa_edge_cases_cold_64();
LAB_0015b945:
  test_ecdsa_edge_cases_cold_74();
LAB_0015b94a:
  test_ecdsa_edge_cases_cold_51();
LAB_0015b94f:
  test_ecdsa_edge_cases_cold_52();
LAB_0015b954:
  test_ecdsa_edge_cases_cold_53();
LAB_0015b959:
  test_ecdsa_edge_cases_cold_54();
LAB_0015b95e:
  test_ecdsa_edge_cases_cold_55();
LAB_0015b963:
  test_ecdsa_edge_cases_cold_56();
LAB_0015b968:
  test_ecdsa_edge_cases_cold_57();
LAB_0015b96d:
  test_ecdsa_edge_cases_cold_78();
LAB_0015b972:
  test_ecdsa_edge_cases_cold_58();
LAB_0015b977:
  test_ecdsa_edge_cases_cold_77();
LAB_0015b97c:
  test_ecdsa_edge_cases_cold_59();
LAB_0015b981:
  test_ecdsa_edge_cases_cold_60();
LAB_0015b986:
  test_ecdsa_edge_cases_cold_76();
LAB_0015b98b:
  test_ecdsa_edge_cases_cold_61();
LAB_0015b990:
  test_ecdsa_edge_cases_cold_1();
LAB_0015b995:
  test_ecdsa_edge_cases_cold_101();
LAB_0015b99a:
  test_ecdsa_edge_cases_cold_2();
LAB_0015b99f:
  test_ecdsa_edge_cases_cold_100();
LAB_0015b9a4:
  test_ecdsa_edge_cases_cold_3();
LAB_0015b9a9:
  test_ecdsa_edge_cases_cold_99();
LAB_0015b9ae:
  test_ecdsa_edge_cases_cold_98();
LAB_0015b9b3:
  test_ecdsa_edge_cases_cold_97();
LAB_0015b9b8:
  test_ecdsa_edge_cases_cold_96();
LAB_0015b9bd:
  test_ecdsa_edge_cases_cold_95();
LAB_0015b9c2:
  test_ecdsa_edge_cases_cold_94();
LAB_0015b9c7:
  test_ecdsa_edge_cases_cold_4();
LAB_0015b9cc:
  test_ecdsa_edge_cases_cold_5();
LAB_0015b9d1:
  test_ecdsa_edge_cases_cold_93();
LAB_0015b9d6:
  test_ecdsa_edge_cases_cold_92();
LAB_0015b9db:
  test_ecdsa_edge_cases_cold_91();
LAB_0015b9e0:
  test_ecdsa_edge_cases_cold_90();
LAB_0015b9e5:
  test_ecdsa_edge_cases_cold_89();
LAB_0015b9ea:
  test_ecdsa_edge_cases_cold_88();
LAB_0015b9ef:
  test_ecdsa_edge_cases_cold_6();
LAB_0015b9f4:
  test_ecdsa_edge_cases_cold_7();
LAB_0015b9f9:
  test_ecdsa_edge_cases_cold_87();
LAB_0015b9fe:
  test_ecdsa_edge_cases_cold_86();
LAB_0015ba03:
  test_ecdsa_edge_cases_cold_85();
LAB_0015ba08:
  test_ecdsa_edge_cases_cold_8();
LAB_0015ba0d:
  test_ecdsa_edge_cases_cold_9();
LAB_0015ba12:
  test_ecdsa_edge_cases_cold_10();
LAB_0015ba17:
  test_ecdsa_edge_cases_cold_11();
  psVar14 = extraout_RAX;
LAB_0015ba1c:
  (*(psVar14->illegal_callback).fn)
            ("ctx != secp256k1_context_static",(psVar14->illegal_callback).data);
  goto LAB_0015a5ed;
}

Assistant:

static void test_ecdsa_edge_cases(void) {
    int t;
    secp256k1_ecdsa_signature sig;

    /* Test the case where ECDSA recomputes a point that is infinity. */
    {
        secp256k1_gej keyj;
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_negate(&ss, &ss);
        secp256k1_scalar_inverse(&ss, &ss);
        secp256k1_scalar_set_int(&sr, 1);
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &keyj, &sr);
        secp256k1_ge_set_gej(&key, &keyj);
        msg = ss;
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with r of zero fails. */
    {
        const unsigned char pubkey_mods_zero[33] = {
            0x02, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xfe, 0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0,
            0x3b, 0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41,
            0x41
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 0);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey_mods_zero, 33));
        CHECK(secp256k1_ecdsa_sig_verify( &sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with s of zero fails. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x01
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 0);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 1);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with message 0 passes. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x02
        };
        const unsigned char pubkey2[33] = {
            0x02, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xfe, 0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0,
            0x3b, 0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41,
            0x43
        };
        secp256k1_ge key;
        secp256k1_ge key2;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 2);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 2);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_eckey_pubkey_parse(&key2, pubkey2, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 0);
    }

    /* Verify signature with message 1 passes. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x14, 0x4e, 0x5a, 0x58, 0xef, 0x5b, 0x22,
            0x6f, 0xd2, 0xe2, 0x07, 0x6a, 0x77, 0xcf, 0x05,
            0xb4, 0x1d, 0xe7, 0x4a, 0x30, 0x98, 0x27, 0x8c,
            0x93, 0xe6, 0xe6, 0x3c, 0x0b, 0xc4, 0x73, 0x76,
            0x25
        };
        const unsigned char pubkey2[33] = {
            0x02, 0x8a, 0xd5, 0x37, 0xed, 0x73, 0xd9, 0x40,
            0x1d, 0xa0, 0x33, 0xd2, 0xdc, 0xf0, 0xaf, 0xae,
            0x34, 0xcf, 0x5f, 0x96, 0x4c, 0x73, 0x28, 0x0f,
            0x92, 0xc0, 0xf6, 0x9d, 0xd9, 0xb2, 0x09, 0x10,
            0x62
        };
        const unsigned char csr[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
            0x45, 0x51, 0x23, 0x19, 0x50, 0xb7, 0x5f, 0xc4,
            0x40, 0x2d, 0xa1, 0x72, 0x2f, 0xc9, 0xba, 0xeb
        };
        secp256k1_ge key;
        secp256k1_ge key2;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 1);
        secp256k1_scalar_set_b32(&sr, csr, NULL);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_eckey_pubkey_parse(&key2, pubkey2, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 2);
        secp256k1_scalar_inverse_var(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 0);
    }

    /* Verify signature with message -1 passes. */
    {
        const unsigned char pubkey[33] = {
            0x03, 0xaf, 0x97, 0xff, 0x7d, 0x3a, 0xf6, 0xa0,
            0x02, 0x94, 0xbd, 0x9f, 0x4b, 0x2e, 0xd7, 0x52,
            0x28, 0xdb, 0x49, 0x2a, 0x65, 0xcb, 0x1e, 0x27,
            0x57, 0x9c, 0xba, 0x74, 0x20, 0xd5, 0x1d, 0x20,
            0xf1
        };
        const unsigned char csr[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
            0x45, 0x51, 0x23, 0x19, 0x50, 0xb7, 0x5f, 0xc4,
            0x40, 0x2d, 0xa1, 0x72, 0x2f, 0xc9, 0xba, 0xee
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 1);
        secp256k1_scalar_negate(&msg, &msg);
        secp256k1_scalar_set_b32(&sr, csr, NULL);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 3);
        secp256k1_scalar_inverse_var(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Signature where s would be zero. */
    {
        secp256k1_pubkey pubkey;
        size_t siglen;
        unsigned char signature[72];
        static const unsigned char nonce[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
        };
        static const unsigned char nonce2[32] = {
            0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,
            0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFE,
            0xBA,0xAE,0xDC,0xE6,0xAF,0x48,0xA0,0x3B,
            0xBF,0xD2,0x5E,0x8C,0xD0,0x36,0x41,0x40
        };
        const unsigned char key[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
        };
        unsigned char msg[32] = {
            0x86, 0x41, 0x99, 0x81, 0x06, 0x23, 0x44, 0x53,
            0xaa, 0x5f, 0x9d, 0x6a, 0x31, 0x78, 0xf4, 0xf7,
            0xb8, 0x12, 0xe0, 0x0b, 0x81, 0x7a, 0x77, 0x62,
            0x65, 0xdf, 0xdd, 0x31, 0xb9, 0x3e, 0x29, 0xa9,
        };
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce) == 0);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce2) == 0);
        msg[31] = 0xaa;
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_sign(CTX, NULL, msg, key, precomputed_nonce_function, nonce2));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_sign(CTX, &sig, NULL, key, precomputed_nonce_function, nonce2));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_sign(CTX, &sig, msg, NULL, precomputed_nonce_function, nonce2));
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce2) == 1);
        CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, key) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, NULL, msg, &pubkey));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, &sig, NULL, &pubkey));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, &sig, msg, NULL));
        CHECK(secp256k1_ecdsa_verify(CTX, &sig, msg, &pubkey) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ec_pubkey_create(CTX, &pubkey, NULL));
        /* That pubkeyload fails via an ARGCHECK is a little odd but makes sense because pubkeys are an opaque data type. */
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, &sig, msg, &pubkey));
        siglen = 72;
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_der(CTX, NULL, &siglen, &sig));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_der(CTX, signature, NULL, &sig));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, NULL));
        CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, &sig) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_der(CTX, NULL, signature, siglen));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_der(CTX, &sig, NULL, siglen));
        CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &sig, signature, siglen) == 1);
        siglen = 10;
        /* Too little room for a signature does not fail via ARGCHECK. */
        CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, &sig) == 0);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_normalize(CTX, NULL, NULL));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_compact(CTX, NULL, &sig));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_compact(CTX, signature, NULL));
        CHECK(secp256k1_ecdsa_signature_serialize_compact(CTX, signature, &sig) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_compact(CTX, NULL, signature));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_compact(CTX, &sig, NULL));
        CHECK(secp256k1_ecdsa_signature_parse_compact(CTX, &sig, signature) == 1);
        memset(signature, 255, 64);
        CHECK(secp256k1_ecdsa_signature_parse_compact(CTX, &sig, signature) == 0);
    }

    /* Nonce function corner cases. */
    for (t = 0; t < 2; t++) {
        static const unsigned char zero[32] = {0x00};
        int i;
        unsigned char key[32];
        unsigned char msg[32];
        secp256k1_ecdsa_signature sig2;
        secp256k1_scalar sr[512], ss;
        const unsigned char *extra;
        extra = t == 0 ? NULL : zero;
        memset(msg, 0, 32);
        msg[31] = 1;
        /* High key results in signature failure. */
        memset(key, 0xFF, 32);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, NULL, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* Zero key results in signature failure. */
        memset(key, 0, 32);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, NULL, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* Nonce function failure results in signature failure. */
        key[31] = 1;
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, nonce_function_test_fail, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* The retry loop successfully makes its way to the first good value. */
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, nonce_function_test_retry, extra) == 1);
        CHECK(!is_empty_signature(&sig));
        CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, nonce_function_rfc6979, extra) == 1);
        CHECK(!is_empty_signature(&sig2));
        CHECK(secp256k1_memcmp_var(&sig, &sig2, sizeof(sig)) == 0);
        /* The default nonce function is deterministic. */
        CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
        CHECK(!is_empty_signature(&sig2));
        CHECK(secp256k1_memcmp_var(&sig, &sig2, sizeof(sig)) == 0);
        /* The default nonce function changes output with different messages. */
        for(i = 0; i < 256; i++) {
            int j;
            msg[0] = i;
            CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
            CHECK(!is_empty_signature(&sig2));
            secp256k1_ecdsa_signature_load(CTX, &sr[i], &ss, &sig2);
            for (j = 0; j < i; j++) {
                CHECK(!secp256k1_scalar_eq(&sr[i], &sr[j]));
            }
        }
        msg[0] = 0;
        msg[31] = 2;
        /* The default nonce function changes output with different keys. */
        for(i = 256; i < 512; i++) {
            int j;
            key[0] = i - 256;
            CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
            CHECK(!is_empty_signature(&sig2));
            secp256k1_ecdsa_signature_load(CTX, &sr[i], &ss, &sig2);
            for (j = 0; j < i; j++) {
                CHECK(!secp256k1_scalar_eq(&sr[i], &sr[j]));
            }
        }
        key[0] = 0;
    }

    {
        /* Check that optional nonce arguments do not have equivalent effect. */
        const unsigned char zeros[32] = {0};
        unsigned char nonce[32];
        unsigned char nonce2[32];
        unsigned char nonce3[32];
        unsigned char nonce4[32];
        SECP256K1_CHECKMEM_UNDEFINE(nonce,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce2,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce3,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce4,32);
        CHECK(nonce_function_rfc6979(nonce, zeros, zeros, NULL, NULL, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce,32);
        CHECK(nonce_function_rfc6979(nonce2, zeros, zeros, zeros, NULL, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce2,32);
        CHECK(nonce_function_rfc6979(nonce3, zeros, zeros, NULL, (void *)zeros, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce3,32);
        CHECK(nonce_function_rfc6979(nonce4, zeros, zeros, zeros, (void *)zeros, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce4,32);
        CHECK(secp256k1_memcmp_var(nonce, nonce2, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce, nonce3, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce, nonce4, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce2, nonce3, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce2, nonce4, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce3, nonce4, 32) != 0);
    }


    /* Privkey export where pubkey is the point at infinity. */
    {
        unsigned char privkey[300];
        unsigned char seckey[32] = {
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xfe,
            0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0, 0x3b,
            0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41, 0x41,
        };
        size_t outlen = 300;
        CHECK(!ec_privkey_export_der(CTX, privkey, &outlen, seckey, 0));
        outlen = 300;
        CHECK(!ec_privkey_export_der(CTX, privkey, &outlen, seckey, 1));
    }
}